

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  bool bVar1;
  ContentEncoding *pCVar2;
  long lVar3;
  ContentCompression **ppCVar4;
  ContentEncryption **ppCVar5;
  ContentEncryption *this_00;
  unsigned_long_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ContentEncryption *pCVar9;
  long unaff_R13;
  ulong uVar10;
  ulong uVar11;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_60;
  ContentEncoding *local_58;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  longlong local_38;
  
  stop = size + start;
  uVar10 = 0;
  uVar7 = 0;
  local_60 = start;
  local_58 = this;
  local_48 = pReader;
  local_38 = start;
  while (local_60 < stop) {
    lVar3 = ParseElementHeader(local_48,&local_60,stop,&local_40,&local_50);
    if (lVar3 < 0) {
      bVar1 = false;
    }
    else {
      uVar8 = uVar7;
      if ((local_40 == 0x5034) && (uVar8 = uVar7 + 1, 0x7ffffffe < (long)uVar7)) {
        bVar1 = false;
        uVar7 = uVar8;
        lVar3 = -1;
      }
      else {
        uVar11 = uVar10;
        uVar7 = uVar8;
        if ((local_40 == 0x5035) && (uVar11 = uVar10 + 1, 0x7ffffffe < (long)uVar10)) {
          bVar1 = false;
          lVar3 = -1;
          uVar10 = uVar11;
        }
        else {
          local_60 = local_60 + local_50;
          bVar1 = local_60 <= stop;
          lVar3 = unaff_R13;
          uVar10 = uVar11;
          if (stop < local_60) {
            lVar3 = -2;
          }
        }
      }
    }
    unaff_R13 = lVar3;
    if (!bVar1) {
      return lVar3;
    }
  }
  if ((long)uVar7 < 1 && (long)uVar10 < 1) {
    return -1;
  }
  if (0 < (long)uVar7) {
    uVar8 = uVar7 * 8;
    if (0x1fffffffffffffff < uVar7) {
      uVar8 = 0xffffffffffffffff;
    }
    ppCVar4 = (ContentCompression **)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    local_58->compression_entries_ = ppCVar4;
    if (ppCVar4 == (ContentCompression **)0x0) {
      return -1;
    }
    local_58->compression_entries_end_ = ppCVar4;
  }
  if (0 < (long)uVar10) {
    uVar7 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar7 = uVar10 * 8;
    }
    ppCVar5 = (ContentEncryption **)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    pCVar2 = local_58;
    local_58->encryption_entries_ = ppCVar5;
    if (ppCVar5 == (ContentEncryption **)0x0) {
      if (local_58->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(local_58->compression_entries_);
      }
      pCVar2->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    local_58->encryption_entries_end_ = ppCVar5;
  }
  local_60 = local_38;
  do {
    if (stop <= local_60) {
      return (ulong)(local_60 == stop) * 2 + -2;
    }
    lVar3 = ParseElementHeader(local_48,&local_60,stop,&local_40,&local_50);
    if (lVar3 < 0) {
      bVar1 = false;
      goto LAB_00161b99;
    }
    lVar3 = unaff_R13;
    switch(local_40) {
    case 0x5031:
      uVar6 = UnserializeUInt(local_48,local_60,local_50);
      local_58->encoding_order_ = uVar6;
      break;
    case 0x5032:
      uVar6 = UnserializeUInt(local_48,local_60,local_50);
      local_58->encoding_scope_ = uVar6;
      if (uVar6 != 0) break;
      lVar3 = -1;
      goto LAB_00161b97;
    case 0x5033:
      uVar6 = UnserializeUInt(local_48,local_60,local_50);
      local_58->encoding_type_ = uVar6;
      break;
    case 0x5034:
      pCVar9 = (ContentEncryption *)0x18;
      this_00 = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (this_00 == (ContentEncryption *)0x0) {
        this_00 = (ContentEncryption *)0x0;
      }
      else {
        pCVar9 = this_00;
        ContentCompression::ContentCompression((ContentCompression *)this_00);
      }
      if (this_00 == (ContentEncryption *)0x0) {
LAB_00161b35:
        bVar1 = false;
        lVar3 = -1;
      }
      else {
        lVar3 = ParseCompressionEntry
                          ((ContentEncoding *)pCVar9,local_60,local_50,local_48,
                           (ContentCompression *)this_00);
        if (lVar3 != 0) {
          ContentCompression::~ContentCompression((ContentCompression *)this_00);
          goto LAB_00161b26;
        }
        ppCVar5 = (ContentEncryption **)local_58->compression_entries_end_;
        local_58->compression_entries_end_ = (ContentCompression **)(ppCVar5 + 1);
LAB_00161b64:
        *ppCVar5 = this_00;
        bVar1 = true;
        lVar3 = unaff_R13;
      }
      goto LAB_00161b6e;
    case 0x5035:
      pCVar9 = (ContentEncryption *)0x50;
      this_00 = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (this_00 == (ContentEncryption *)0x0) {
        this_00 = (ContentEncryption *)0x0;
      }
      else {
        pCVar9 = this_00;
        ContentEncryption::ContentEncryption(this_00);
      }
      if (this_00 == (ContentEncryption *)0x0) goto LAB_00161b35;
      lVar3 = ParseEncryptionEntry((ContentEncoding *)pCVar9,local_60,local_50,local_48,this_00);
      if (lVar3 == 0) {
        ppCVar5 = local_58->encryption_entries_end_;
        local_58->encryption_entries_end_ = ppCVar5 + 1;
        goto LAB_00161b64;
      }
      ContentEncryption::~ContentEncryption(this_00);
LAB_00161b26:
      operator_delete(this_00);
      bVar1 = false;
LAB_00161b6e:
      if (bVar1) break;
LAB_00161b97:
      bVar1 = false;
      goto LAB_00161b99;
    }
    local_60 = local_60 + local_50;
    bVar1 = local_60 <= stop;
    if (stop < local_60) {
      lVar3 = -2;
    }
LAB_00161b99:
    unaff_R13 = lVar3;
    if (!bVar1) {
      return lVar3;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}